

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

int Gia_ObjCheckTfi(Gia_Man_t *p,Gia_Obj_t *pOld,Gia_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vVisited_00;
  ulong *puVar3;
  int local_38;
  int i;
  int RetValue;
  Gia_Obj_t *pObj;
  Vec_Ptr_t *vVisited;
  Gia_Obj_t *pNode_local;
  Gia_Obj_t *pOld_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_IsComplement(pOld);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x71d,"int Gia_ObjCheckTfi(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Gia_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x71e,"int Gia_ObjCheckTfi(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  vVisited_00 = Vec_PtrAlloc(100);
  iVar1 = Gia_ObjCheckTfi_rec(p,pOld,pNode,vVisited_00);
  for (local_38 = 0; iVar2 = Vec_PtrSize(vVisited_00), local_38 < iVar2; local_38 = local_38 + 1) {
    puVar3 = (ulong *)Vec_PtrEntry(vVisited_00,local_38);
    *puVar3 = *puVar3 & 0xffffffffbfffffff;
  }
  Vec_PtrFree(vVisited_00);
  return iVar1;
}

Assistant:

int Gia_ObjCheckTfi( Gia_Man_t * p, Gia_Obj_t * pOld, Gia_Obj_t * pNode )
{
    Vec_Ptr_t * vVisited;
    Gia_Obj_t * pObj;
    int RetValue, i;
    assert( !Gia_IsComplement(pOld) );
    assert( !Gia_IsComplement(pNode) );
    vVisited = Vec_PtrAlloc( 100 );
    RetValue = Gia_ObjCheckTfi_rec( p, pOld, pNode, vVisited );
    Vec_PtrForEachEntry( Gia_Obj_t *, vVisited, pObj, i )
        pObj->fMark0 = 0;
    Vec_PtrFree( vVisited );
    return RetValue;
}